

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tree_data_new.c
# Opt level: O1

LY_ERR lyd_new_ext_term(lysc_ext_instance *ext,char *name,void *value,size_t value_len,
                       uint32_t options,lyd_node **node)

{
  LY_ERR ret__;
  LY_ERR LVar1;
  lysc_node *schema;
  char *pcVar2;
  byte store_only;
  ly_ctx *ctx;
  LY_VALUE_FORMAT format;
  lyd_node *ret;
  char *local_40;
  size_t local_38;
  
  ret = (lyd_node *)0x0;
  if (ext == (lysc_ext_instance *)0x0) {
    ctx = (ly_ctx *)0x0;
    pcVar2 = "ext";
  }
  else {
    ctx = ext->module->ctx;
    if (node == (lyd_node **)0x0) {
      pcVar2 = "node";
    }
    else if (name == (char *)0x0) {
      pcVar2 = "name";
    }
    else {
      local_40 = (char *)value;
      local_38 = value_len;
      LVar1 = lyd_new_val_get_format(options,&format);
      if (LVar1 != LY_SUCCESS) {
        return LVar1;
      }
      store_only = (byte)options >> 1 & 1;
      if ((store_only == 0) || ((format != LY_VALUE_LYB && (format != LY_VALUE_CANON)))) {
        schema = lysc_ext_find_node(ext,(lys_module *)0x0,name,0,0xc,0);
        if (schema == (lysc_node *)0x0) {
          pcVar2 = ext->def->name;
          if (ext->argument == (char *)0x0) {
            ly_log(ctx,LY_LLERR,LY_EINVAL,"Term node \"%s\" not found in instance of extension %s.",
                   name,pcVar2);
          }
          else {
            ly_log(ctx,LY_LLERR,LY_EINVAL,
                   "Term node \"%s\" not found in instance \"%s\" of extension %s.",name,
                   ext->argument,pcVar2);
          }
          return LY_ENOTFOUND;
        }
        LVar1 = lyd_create_term(schema,local_40,local_38,'\0',store_only,(ly_bool *)0x0,format,
                                (void *)0x0,0x3f3,(ly_bool *)0x0,&ret);
        if (LVar1 != LY_SUCCESS) {
          return LVar1;
        }
        *node = ret;
        return LY_SUCCESS;
      }
      pcVar2 = "!(store_only && (format == LY_VALUE_CANON || format == LY_VALUE_LYB))";
    }
  }
  ly_log(ctx,LY_LLERR,LY_EINVAL,"Invalid argument %s (%s()).",pcVar2,"lyd_new_ext_term");
  return LY_EINVAL;
}

Assistant:

LIBYANG_API_DEF LY_ERR
lyd_new_ext_term(const struct lysc_ext_instance *ext, const char *name, const void *value, size_t value_len,
        uint32_t options, struct lyd_node **node)
{
    LY_ERR rc;
    struct lyd_node *ret = NULL;
    const struct lysc_node *schema;
    struct ly_ctx *ctx = ext ? ext->module->ctx : NULL;
    ly_bool store_only = (options & LYD_NEW_VAL_STORE_ONLY) ? 1 : 0;
    LY_VALUE_FORMAT format;

    LY_CHECK_ARG_RET(ctx, ext, node, name, LY_EINVAL);
    LY_CHECK_RET(lyd_new_val_get_format(options, &format));
    LY_CHECK_ARG_RET(ctx, !(store_only && (format == LY_VALUE_CANON || format == LY_VALUE_LYB)), LY_EINVAL);

    schema = lysc_ext_find_node(ext, NULL, name, 0, LYD_NODE_TERM, 0);
    if (!schema) {
        if (ext->argument) {
            LOGERR(ctx, LY_EINVAL, "Term node \"%s\" not found in instance \"%s\" of extension %s.",
                    name, ext->argument, ext->def->name);
        } else {
            LOGERR(ctx, LY_EINVAL, "Term node \"%s\" not found in instance of extension %s.", name, ext->def->name);
        }
        return LY_ENOTFOUND;
    }
    rc = lyd_create_term(schema, value, value_len, 0, store_only, NULL, format, NULL, LYD_HINT_DATA, NULL, &ret);
    LY_CHECK_RET(rc);

    *node = ret;

    return LY_SUCCESS;
}